

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

void __thiscall VCCLCompilerTool::VCCLCompilerTool(VCCLCompilerTool *this)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  Data *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_VCToolBase)._vptr_VCToolBase = (_func_int **)&PTR__VCCLCompilerTool_002e2cc8;
  (this->BrowseInformationFile).d.d = (Data *)0x0;
  (this->BrowseInformationFile).d.ptr = (char16_t *)0x0;
  (this->BrowseInformationFile).d.size = 0;
  (this->AdditionalIncludeDirectories).d.d = (Data *)0x0;
  (this->AdditionalIncludeDirectories).d.ptr = (QString *)0x0;
  (this->AdditionalIncludeDirectories).d.size = 0;
  (this->AdditionalOptions).d.d = (Data *)0x0;
  (this->AdditionalOptions).d.ptr = (QString *)0x0;
  (this->AdditionalOptions).d.size = 0;
  (this->AdditionalUsingDirectories).d.d = (Data *)0x0;
  (this->AdditionalUsingDirectories).d.ptr = (QString *)0x0;
  (this->AdditionalUsingDirectories).d.size = 0;
  (this->AssemblerListingLocation).d.d = (Data *)0x0;
  (this->AssemblerListingLocation).d.ptr = (char16_t *)0x0;
  (this->AssemblerListingLocation).d.size = 0;
  *(undefined8 *)((long)&(this->AssemblerListingLocation).d.size + 4) = 0;
  this->BasicRuntimeChecks = runtimeBasicCheckNone;
  this->BrowseInformation = brInfoNone;
  this->BufferSecurityCheck = unset;
  this->CallingConvention = callConventionDefault;
  this->CompileAs = compileAsDefault;
  this->CompileAsManaged = managedDefault;
  this->CompileAsWinRT = unset;
  this->CompileOnly = unset;
  this->DebugInformationFormat = debugDisabled;
  this->Detect64BitPortabilityProblems = unset;
  this->DisableLanguageExtensions = unset;
  (this->DisableSpecificWarnings).d.d = (Data *)0x0;
  (this->DisableSpecificWarnings).d.ptr = (QString *)0x0;
  *(undefined8 *)((long)&(this->DisableSpecificWarnings).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->DisableSpecificWarnings).d.size + 4) = 0;
  this->EnableFiberSafeOptimizations = unset;
  this->EnableFunctionLevelLinking = unset;
  this->EnableIntrinsicFunctions = unset;
  this->ExceptionHandling = ehDefault;
  this->ExpandAttributedSource = unset;
  this->FavorSizeOrSpeed = favorNone;
  this->FloatingPointModel = floatingPointNotSet;
  this->FloatingPointExceptions = unset;
  this->ForceConformanceInForLoopScope = unset;
  (this->ForcedIncludeFiles).d.d = (Data *)0x0;
  (this->ForcedIncludeFiles).d.ptr = (QString *)0x0;
  (this->ForcedIncludeFiles).d.size = 0;
  (this->ForcedUsingFiles).d.d = (Data *)0x0;
  (this->ForcedUsingFiles).d.ptr = (QString *)0x0;
  (this->ForcedUsingFiles).d.size = 0;
  this->GeneratePreprocessedFile = preprocessNo;
  this->PreprocessSuppressLineNumbers = unset;
  this->GlobalOptimizations = unset;
  this->IgnoreStandardIncludePath = unset;
  this->ImproveFloatingPointConsistency = unset;
  this->InlineFunctionExpansion = expandDefault;
  this->KeepComments = unset;
  (this->LanguageStandard).d.d = (Data *)0x0;
  (this->LanguageStandard).d.ptr = (char16_t *)0x0;
  (this->LanguageStandard).d.size = 0;
  (this->LanguageStandard_C).d.d = (Data *)0x0;
  (this->LanguageStandard_C).d.ptr = (char16_t *)0x0;
  (this->LanguageStandard_C).d.size = 0;
  this->MinimalRebuild = unset;
  (this->ObjectFile).d.d = (Data *)0x0;
  (this->ObjectFile).d.ptr = (char16_t *)0x0;
  (this->ObjectFile).d.size = 0;
  this->OmitDefaultLibName = unset;
  this->OmitFramePointers = unset;
  this->OpenMP = unset;
  this->Optimization = optimizeCustom;
  this->OptimizeForProcessor = procOptimizeBlended;
  this->OptimizeForWindowsApplication = unset;
  (this->PreprocessorDefinitions).d.ptr = (QString *)0x0;
  (this->PreprocessorDefinitions).d.size = 0;
  (this->PrecompiledHeaderThrough).d.size = 0;
  (this->PreprocessorDefinitions).d.d = (Data *)0x0;
  (this->PrecompiledHeaderThrough).d.d = (Data *)0x0;
  (this->PrecompiledHeaderThrough).d.ptr = (char16_t *)0x0;
  (this->PrecompiledHeaderFile).d.ptr = (char16_t *)0x0;
  (this->PrecompiledHeaderFile).d.size = 0;
  (this->OutputFile).d.size = 0;
  (this->PrecompiledHeaderFile).d.d = (Data *)0x0;
  (this->OutputFile).d.d = (Data *)0x0;
  (this->OutputFile).d.ptr = (char16_t *)0x0;
  QVar1.m_data = (storage_type *)0x0;
  QVar1.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar1);
  (this->ProgramDataBaseFileName).d.d = local_58;
  (this->ProgramDataBaseFileName).d.ptr = pcStack_50;
  (this->ProgramDataBaseFileName).d.size = local_48;
  this->RuntimeLibrary = rtMultiThreaded;
  this->RuntimeTypeInfo = unset;
  this->ShowIncludes = unset;
  this->SmallerTypeCheck = unset;
  this->StringPooling = unset;
  this->StructMemberAlignment = alignNotSet;
  this->SuppressStartupBanner = unset;
  this->TreatWChar_tAsBuiltInType = unset;
  this->TurnOffAssemblyGeneration = unset;
  this->UndefineAllPreprocessorDefinitions = unset;
  (this->UndefinePreprocessorDefinitions).d.d = (Data *)0x0;
  (this->UndefinePreprocessorDefinitions).d.ptr = (QString *)0x0;
  (this->UndefinePreprocessorDefinitions).d.size = 0;
  this->UsePrecompiledHeader = pchUnset;
  this->UseUnicodeForAssemblerListing = unset;
  (this->TreatSpecificWarningsAsErrors).d.d = (Data *)0x0;
  (this->TreatSpecificWarningsAsErrors).d.ptr = (QString *)0x0;
  (this->TreatSpecificWarningsAsErrors).d.size = 0;
  this->WarnAsError = unset;
  this->WarningLevel = warningLevel_0;
  this->WholeProgramOptimization = unset;
  this->CompileForArchitecture = archUnknown;
  this->InterworkCalls = unset;
  this->EnablePREfast = unset;
  this->DisplayFullPaths = _False;
  this->MultiProcessorCompilation = unset;
  (this->MultiProcessorCompilationProcessorCount).d.d = (Data *)0x0;
  (this->MultiProcessorCompilationProcessorCount).d.ptr = (char16_t *)0x0;
  (this->MultiProcessorCompilationProcessorCount).d.size = 0;
  this->GenerateXMLDocumentationFiles = unset;
  (this->XMLDocumentationFileName).d.d = (Data *)0x0;
  (this->XMLDocumentationFileName).d.ptr = (char16_t *)0x0;
  (this->XMLDocumentationFileName).d.size = 0;
  (this->ErrorReporting).d.d = (Data *)0x0;
  (this->ErrorReporting).d.ptr = (char16_t *)0x0;
  (this->ErrorReporting).d.size = 0;
  this->CreateHotpatchableImage = unset;
  (this->PreprocessOutputPath).d.size = 0;
  (this->PreprocessOutputPath).d.d = (Data *)0x0;
  (this->PreprocessOutputPath).d.ptr = (char16_t *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VCCLCompilerTool::VCCLCompilerTool()
    :        AssemblerOutput(asmListingNone),
        BasicRuntimeChecks(runtimeBasicCheckNone),
        BrowseInformation(brInfoNone),
        BufferSecurityCheck(unset),
        CallingConvention(callConventionDefault),
        CompileAs(compileAsDefault),
        CompileAsManaged(managedDefault),
        CompileAsWinRT(unset),
        CompileOnly(unset),
        DebugInformationFormat(debugDisabled),
        Detect64BitPortabilityProblems(unset),
        DisableLanguageExtensions(unset),
        EnableEnhancedInstructionSet(archNotSet),
        EnableFiberSafeOptimizations(unset),
        EnableFunctionLevelLinking(unset),
        EnableIntrinsicFunctions(unset),
        ExceptionHandling(ehDefault),
        ExpandAttributedSource(unset),
        FavorSizeOrSpeed(favorNone),
        FloatingPointModel(floatingPointNotSet),
        FloatingPointExceptions(unset),
        ForceConformanceInForLoopScope(unset),
        GeneratePreprocessedFile(preprocessNo),
        PreprocessSuppressLineNumbers(unset),
        GlobalOptimizations(unset),
        IgnoreStandardIncludePath(unset),
        ImproveFloatingPointConsistency(unset),
        InlineFunctionExpansion(expandDefault),
        KeepComments(unset),
        MinimalRebuild(unset),
        OmitDefaultLibName(unset),
        OmitFramePointers(unset),
        OpenMP(unset),
        Optimization(optimizeCustom),
        OptimizeForProcessor(procOptimizeBlended),
        OptimizeForWindowsApplication(unset),
        ProgramDataBaseFileName(""),
        RuntimeLibrary(rtMultiThreaded),
        RuntimeTypeInfo(unset),
        ShowIncludes(unset),
        SmallerTypeCheck(unset),
        StringPooling(unset),
        StructMemberAlignment(alignNotSet),
        SuppressStartupBanner(unset),
        TreatWChar_tAsBuiltInType(unset),
        TurnOffAssemblyGeneration(unset),
        UndefineAllPreprocessorDefinitions(unset),
        UsePrecompiledHeader(pchUnset),
        UseUnicodeForAssemblerListing(unset),
        WarnAsError(unset),
        WarningLevel(warningLevel_0),
        WholeProgramOptimization(unset),
        CompileForArchitecture(archUnknown),
        InterworkCalls(unset),
        EnablePREfast(unset),
        DisplayFullPaths(_False),
        MultiProcessorCompilation(unset),
        GenerateXMLDocumentationFiles(unset),
        CreateHotpatchableImage(unset)
{
}